

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool character_equip_oneslot(Character *character,short item,uchar subloc,EquipLocation slot)

{
  int iVar1;
  reference pvVar2;
  EquipLocation slot_local;
  uchar subloc_local;
  short item_local;
  Character *character_local;
  
  pvVar2 = std::array<int,_15UL>::operator[](&character->paperdoll,(ulong)slot);
  iVar1 = *pvVar2;
  if (iVar1 == 0) {
    pvVar2 = std::array<int,_15UL>::operator[](&character->paperdoll,(ulong)slot);
    *pvVar2 = (int)item;
    Character::DelItem(character,item,1);
    Character::CalculateStats(character,true);
  }
  return iVar1 == 0;
}

Assistant:

static bool character_equip_oneslot(Character *character, short item, unsigned char subloc, Character::EquipLocation slot)
{
	(void)subloc;

	if (character->paperdoll[slot] != 0)
	{
		return false;
	}

	character->paperdoll[slot] = item;
	character->DelItem(item, 1);

	character->CalculateStats();
	return true;
}